

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::BbrDataset&,unsigned_short>>
               (tuple<testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
                *matcher_tuple,tuple<ot::commissioner::BbrDataset_&,_unsigned_short> *value_tuple)

{
  bool bVar1;
  MatcherBase<unsigned_short> *this;
  __tuple_element_t<1UL,_tuple<BbrDataset_&,_unsigned_short>_> *x;
  undefined1 local_19;
  tuple<ot::commissioner::BbrDataset_&,_unsigned_short> *value_tuple_local;
  tuple<testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::BbrDataset&,unsigned_short>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<1ul,testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>
                      (matcher_tuple)->super_MatcherBase<unsigned_short>;
    x = std::get<1ul,ot::commissioner::BbrDataset&,unsigned_short>(value_tuple);
    local_19 = MatcherBase<unsigned_short>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }